

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O3

void anon_unknown.dwarf_2d90c::compail_fail
               (int id,string *defines,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *code)

{
  pointer psVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pbVar2;
  _Alloc_hider _Var3;
  _AutomatonPtr **pp_Var4;
  size_type sVar5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  ostream *poVar12;
  istream *piVar13;
  ostream *poVar14;
  uint uVar15;
  char *pcVar16;
  ulong uVar17;
  undefined8 uVar18;
  uint uVar19;
  pointer __s;
  uint __uval;
  uint __val;
  element_type *peVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line_1;
  _Bit_iterator _Var21;
  regex include_rgx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> include;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  stringstream errors_1;
  file<std::basic_ifstream<char,_std::char_traits<char>_>_> output;
  stringstream command;
  undefined1 local_618 [8];
  pointer psStack_610;
  undefined1 local_608 [16];
  value_type local_5f8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_5d8;
  ulong local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_5b0;
  string local_5a8;
  long *local_588;
  long local_580;
  long local_578 [2];
  undefined1 local_568 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Bit_pointer local_548;
  ios_base local_4e8 [264];
  undefined1 local_3e0 [8];
  streamsize local_3d8;
  _func_int *local_3d0 [29];
  long *local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  undefined **local_2c8;
  undefined8 local_2c0 [33];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_5b0 = errors;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"error","");
  __val = -id;
  if (0 < id) {
    __val = id;
  }
  uVar19 = 1;
  if (9 < __val) {
    uVar17 = (ulong)__val;
    uVar6 = 4;
    do {
      uVar19 = uVar6;
      uVar15 = (uint)uVar17;
      if (uVar15 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_0010fe5d;
      }
      if (uVar15 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_0010fe5d;
      }
      if (uVar15 < 10000) goto LAB_0010fe5d;
      uVar17 = uVar17 / 10000;
      uVar6 = uVar19 + 4;
    } while (99999 < uVar15);
    uVar19 = uVar19 + 1;
  }
LAB_0010fe5d:
  cVar7 = (char)(id >> 0x1f);
  local_5d8._0_8_ = &local_5d8._M_automaton;
  std::__cxx11::string::_M_construct((ulong)&local_5d8,(char)uVar19 - cVar7);
  local_5b8 = (ulong)((uint)id >> 0x1f);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((__shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               *)local_5d8._0_8_)->_M_ptr + local_5b8),uVar19,__val);
  peVar20 = (element_type *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    peVar20 = (element_type *)
              CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                       local_5f8.field_2._M_local_buf[0]);
  }
  if (peVar20 < (element_type *)(local_5d8._8_8_ + local_5f8._M_string_length)) {
    peVar20 = (element_type *)0xf;
    if ((_AutomatonPtr *)local_5d8._0_8_ != &local_5d8._M_automaton) {
      peVar20 = local_5d8._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    if (peVar20 < (element_type *)(local_5d8._8_8_ + local_5f8._M_string_length)) goto LAB_0010fee3;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_5d8,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_0010fee3:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_5f8,local_5d8._0_8_);
  }
  local_618 = (undefined1  [8])local_608;
  psVar1 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == psVar1) {
    local_608._0_8_ =
         (psVar1->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_608._8_8_ = plVar10[3];
  }
  else {
    local_608._0_8_ =
         (psVar1->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_618 = (undefined1  [8])*plVar10;
  }
  psStack_610 = (pointer)plVar10[1];
  *plVar10 = (long)psVar1;
  plVar10[1] = 0;
  *(undefined1 *)
   &(psVar1->
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).first._M_current = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append(local_618);
  poVar14 = (ostream *)(puVar11 + 2);
  if ((ostream *)*puVar11 == poVar14) {
    local_558._M_allocated_capacity = *(undefined8 *)poVar14;
    local_558._8_8_ = puVar11[3];
    local_568._0_8_ = (ostream *)(local_568 + 0x10);
  }
  else {
    local_558._M_allocated_capacity = *(undefined8 *)poVar14;
    local_568._0_8_ = (ostream *)*puVar11;
  }
  local_568._8_8_ = puVar11[1];
  *puVar11 = poVar14;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  file<std::basic_ofstream<char,_std::char_traits<char>_>_>::file
            ((file<std::basic_ofstream<char,_std::char_traits<char>_>_> *)local_3e0,
             (string *)local_568);
  if ((ostream *)local_568._0_8_ != (ostream *)(local_568 + 0x10)) {
    operator_delete((void *)local_568._0_8_,local_558._M_allocated_capacity + 1);
  }
  if (local_618 != (undefined1  [8])local_608) {
    operator_delete((void *)local_618,(ulong)(local_608._0_8_ + 1));
  }
  if ((_AutomatonPtr *)local_5d8._0_8_ != &local_5d8._M_automaton) {
    operator_delete((void *)local_5d8._0_8_,
                    (ulong)((long)&((local_5d8._M_automaton.
                                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super__NFA_base)._M_paren_stack.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,
                    CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                             local_5f8.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"#include <boost/di.hpp>",0x17);
  std::ios::widen((char)(ostream *)local_3e0 + (char)*(_func_int **)((long)local_3e0 + -0x18));
  std::ostream::put((char)local_3e0);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"namespace di = boost::di;",0x19);
  std::ios::widen((char)(ostream *)local_3e0 + (char)*(_func_int **)((long)local_3e0 + -0x18));
  std::ostream::put((char)local_3e0);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,(code->_M_dataplus)._M_p,code->_M_string_length);
  std::__cxx11::stringstream::stringstream((stringstream *)local_568);
  poVar14 = (ostream *)(local_568 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"-Werror",7);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_618,"<include>",0x10);
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_local_buf[0] = '\0';
  __first._M_current = (defines->_M_dataplus)._M_p;
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
            (&local_5f8,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + defines->_M_string_length),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_618,"-include",8,0);
  cxx_abi_cxx11_();
  pp_Var4 = (_AutomatonPtr **)&local_5d8._M_automaton;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_5d8._0_8_,local_5d8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  cxxflags_abi_cxx11_(&local_5a8,true);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,local_5a8._M_dataplus._M_p,local_5a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  std::__cxx11::stringbuf::str();
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_588,local_580);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)local_2e8,(long)local_2e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," 2>",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," error",6);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,".out",4);
  if (local_588 != local_578) {
    operator_delete(local_588,local_578[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((_AutomatonPtr **)local_5d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_5d8._0_8_,
                    (ulong)((long)&((local_5d8._M_automaton.
                                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super__NFA_base)._M_paren_stack.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,
                    CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                             local_5f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_618);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_568);
  std::ios_base::~ios_base(local_4e8);
  local_3e0 = (undefined1  [8])&PTR__ofstream_001338d8;
  local_2c8 = &PTR__ofstream_00133900;
  std::filebuf::~filebuf((filebuf *)&local_3d8);
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  std::ios_base::~ios_base((ios_base *)&local_2c8);
  std::__cxx11::stringbuf::str();
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,(char *)local_3e0,local_3d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  if (local_3e0 != (undefined1  [8])local_3d0) {
    operator_delete((void *)local_3e0,(ulong)(local_3d0[0] + 1));
  }
  std::__cxx11::stringbuf::str();
  iVar9 = system((char *)local_3e0);
  if (iVar9 == 0) {
    pcVar16 = "std::system(command.str().c_str())";
    uVar18 = 0x3f;
    goto LAB_0011095e;
  }
  if (local_3e0 != (undefined1  [8])local_3d0) {
    operator_delete((void *)local_3e0,(ulong)(local_3d0[0] + 1));
  }
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"error","");
  uVar19 = 1;
  if (9 < __val) {
    uVar17 = (ulong)__val;
    uVar6 = 4;
    do {
      uVar19 = uVar6;
      uVar15 = (uint)uVar17;
      if (uVar15 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_001104d1;
      }
      if (uVar15 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_001104d1;
      }
      if (uVar15 < 10000) goto LAB_001104d1;
      uVar17 = uVar17 / 10000;
      uVar6 = uVar19 + 4;
    } while (99999 < uVar15);
    uVar19 = uVar19 + 1;
  }
LAB_001104d1:
  local_5d8._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct((ulong)&local_5d8,(char)uVar19 - cVar7);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&((__shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               *)local_5d8._0_8_)->_M_ptr + local_5b8),uVar19,__val);
  peVar20 = (element_type *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    peVar20 = (element_type *)
              CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                       local_5f8.field_2._M_local_buf[0]);
  }
  if (peVar20 < (element_type *)(local_5d8._8_8_ + local_5f8._M_string_length)) {
    peVar20 = (element_type *)0xf;
    if ((_AutomatonPtr **)local_5d8._0_8_ != pp_Var4) {
      peVar20 = local_5d8._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    }
    if (peVar20 < (element_type *)(local_5d8._8_8_ + local_5f8._M_string_length)) goto LAB_00110546;
    plVar10 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_5d8,0,(char *)0x0,(ulong)local_5f8._M_dataplus._M_p);
  }
  else {
LAB_00110546:
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_5f8,local_5d8._0_8_);
  }
  psVar1 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == psVar1) {
    local_608._0_8_ =
         (psVar1->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_608._8_8_ = plVar10[3];
    local_618 = (undefined1  [8])local_608;
  }
  else {
    local_608._0_8_ =
         (psVar1->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_618 = (undefined1  [8])*plVar10;
  }
  psStack_610 = (pointer)plVar10[1];
  *plVar10 = (long)psVar1;
  plVar10[1] = 0;
  *(undefined1 *)
   &(psVar1->
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).first._M_current = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append(local_618);
  poVar12 = (ostream *)(puVar11 + 2);
  if ((ostream *)*puVar11 == poVar12) {
    local_558._M_allocated_capacity = *(undefined8 *)poVar12;
    local_558._8_8_ = puVar11[3];
    local_568._0_8_ = poVar14;
  }
  else {
    local_558._M_allocated_capacity = *(undefined8 *)poVar12;
    local_568._0_8_ = (ostream *)*puVar11;
  }
  local_568._8_8_ = puVar11[1];
  *puVar11 = poVar12;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  file<std::basic_ifstream<char,_std::char_traits<char>_>_>::file
            ((file<std::basic_ifstream<char,_std::char_traits<char>_>_> *)local_3e0,
             (string *)local_568);
  if ((ostream *)local_568._0_8_ != poVar14) {
    operator_delete((void *)local_568._0_8_,local_558._M_allocated_capacity + 1);
  }
  if (local_618 != (undefined1  [8])local_608) {
    operator_delete((void *)local_618,(ulong)(local_608._0_8_ + 1));
  }
  if ((_AutomatonPtr **)local_5d8._0_8_ != pp_Var4) {
    operator_delete((void *)local_5d8._0_8_,
                    (ulong)((long)&((local_5d8._M_automaton.
                                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super__NFA_base)._M_paren_stack.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,
                    CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                             local_5f8.field_2._M_local_buf[0]) + 1);
  }
  local_618 = (undefined1  [8])((ulong)local_618 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_568,
             (long)(local_5b0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_5b0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)local_618,
             (allocator_type *)&local_5f8);
  local_5a8.field_2._M_allocated_capacity = 0;
  local_5a8._M_dataplus._M_p = (char *)0x0;
  local_5a8._M_string_length = 0;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_5b8 = 0;
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar7 = std::ios::widen((char)*(_func_int **)((long)local_3e0 + -0x18) +
                            (char)(istream *)local_3e0);
    piVar13 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)local_3e0,(string *)&local_5f8,cVar7);
    if (((byte)piVar13[*(long *)(*(long *)piVar13 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5a8,&local_5f8);
    __s = (local_5b0->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (local_5b0->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__s != pbVar2) {
      uVar17 = 0;
      do {
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_5d8,__s,0x10);
        local_608._0_8_ = (element_type *)0x0;
        local_608._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_618 = (undefined1  [8])0x0;
        psStack_610 = (pointer)0x0;
        bVar8 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_5f8._M_dataplus._M_p,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_5f8._M_dataplus._M_p + local_5f8._M_string_length),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_618,&local_5d8,0);
        if (local_618 != (undefined1  [8])0x0) {
          operator_delete((void *)local_618,local_608._0_8_ - (long)local_618);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_5d8)
        ;
        if (bVar8) {
          *(ulong *)(local_568._0_8_ + (uVar17 >> 6) * 8) =
               *(ulong *)(local_568._0_8_ + (uVar17 >> 6) * 8) | 1L << ((byte)uVar17 & 0x3f);
        }
        uVar17 = (ulong)((int)uVar17 + 1);
        __s = __s + 1;
      } while (__s != pbVar2);
    }
    local_5b8 = (ulong)((int)local_5b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,
                    CONCAT71(local_5f8.field_2._M_allocated_capacity._1_7_,
                             local_5f8.field_2._M_local_buf[0]) + 1);
  }
  if ((local_5b0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (local_5b0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish || (uint)local_5b8 < 0x40) {
    local_618 = (undefined1  [8])((ulong)local_618 & 0xffffffffffffff00);
    _Var21 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                       (local_568._0_8_,0,local_558._M_allocated_capacity,
                        local_558._8_8_ & 0xffffffff);
    sVar5 = local_5a8._M_string_length;
    _Var3._M_p = local_5a8._M_dataplus._M_p;
    if ((_Var21.super__Bit_iterator_base._M_p == (_Bit_type *)local_558._M_allocated_capacity) &&
       (_Var21.super__Bit_iterator_base._M_offset == local_558._8_4_)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_5a8);
      if ((ostream *)local_568._0_8_ != (ostream *)0x0) {
        operator_delete((void *)local_568._0_8_,(long)local_548 - local_568._0_8_);
      }
      local_3e0 = (undefined1  [8])
                  (std::ifstream-in-file<std::ifstream>::construction_vtable + 0x18);
      local_2c0[0] = 0x133cd0;
      std::filebuf::~filebuf((filebuf *)local_3d0);
      local_3e0 = (undefined1  [8])(std::istream-in-file<std::ifstream>::construction_vtable + 0x18)
      ;
      local_2c0[0] = 0x133d20;
      local_3d8 = 0;
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      std::ios_base::~ios_base((ios_base *)local_2c0);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return;
    }
    for (; _Var3._M_p != (pointer)sVar5; _Var3._M_p = _Var3._M_p + 0x20) {
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::clog,*(char **)_Var3._M_p,*(long *)(_Var3._M_p + 8));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,(char *)local_618,(long)psStack_610);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if (local_618 != (undefined1  [8])local_608) {
      operator_delete((void *)local_618,(ulong)(local_608._0_8_ + 1));
    }
    pcVar16 = "false";
    uVar18 = 99;
  }
  else {
    std::__cxx11::stringbuf::str();
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::clog,(char *)local_618,(long)psStack_610);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14," | lines < MAX_ERROR_LINES_COUNT",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if (local_618 != (undefined1  [8])local_608) {
      operator_delete((void *)local_618,(ulong)(local_608._0_8_ + 1));
    }
    pcVar16 = "false";
    uVar18 = 0x5a;
  }
LAB_0011095e:
  printf("%s:%d:%s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/test/ft/di_errors.cpp",
         uVar18,pcVar16);
  exit(-1);
}

Assistant:

auto compail_fail(int id, const std::string& defines, const std::vector<std::string>& errors, const std::string& code) {
  std::stringstream command;
  {
    file<> source_code{std::string{"error"} + std::to_string(id) + ".cpp"};
    source_code << "#include <boost/di.hpp>" << std::endl;
    source_code << "namespace di = boost::di;" << std::endl;
    source_code << code;

    std::stringstream errors{};

#if defined(__CLANG__)
    errors << "-Werror";
#elif defined(__GCC__)
    errors << "-Werror";
#elif defined(__MSVC__)
    errors << "/EHsc /W3 /WX";
#endif

    const auto include_rgx = std::regex{"<include>"};

#if defined(__MSVC__)
    const auto include = std::regex_replace(defines, include_rgx, "/FI");
#else
    const auto include = std::regex_replace(defines, include_rgx, "-include");
#endif

    command << cxx() << " " << cxxflags(true) << " " << include << " " << errors.str() << " " << source_code
#if defined(__MSVC__)
            << " >"
#else
            << " 2>"
#endif
            << " error" << id << ".out";
  }

  std::clog << command.str() << std::endl;
  expect(std::system(command.str().c_str()));

  file<std::ifstream> output{std::string{"error"} + std::to_string(id) + ".out"};
  std::vector<bool> matches(errors.size(), false);
  std::vector<std::string> out;
  auto lines = 0;
  for (std::string line; std::getline(output, line);) {
    out.push_back(line);
    auto i = 0;
    for (const auto& rgx : errors) {
      if (std::regex_match(line, std::regex{rgx})) {
        matches[i] = true;
      }
      ++i;
    }
    ++lines;
  }

  if (!errors.empty()) {
#if defined(__MSVC__)
    constexpr auto MAX_ERROR_LINES_COUNT = 128;
#else
    constexpr auto MAX_ERROR_LINES_COUNT = 64;
#endif

    if (lines >= MAX_ERROR_LINES_COUNT) {
      std::clog << command.str() << " | lines < MAX_ERROR_LINES_COUNT" << std::endl;
      expect(false);
    }
  }

  if (std::find(matches.begin(), matches.end(), false) != matches.end()) {
    for (const auto& line : out) {
      std::clog << line << std::endl;
    }
    std::clog << command.str() << std::endl;
    expect(false);
  }
}
}